

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O0

ostream * __thiscall
tchecker::parsing::edge_declaration_t::output(edge_declaration_t *this,ostream *os)

{
  ostream *poVar1;
  element_type *this_00;
  string *psVar2;
  element_type *peVar3;
  element_type *this_01;
  ostream *os_local;
  edge_declaration_t *this_local;
  
  poVar1 = std::operator<<(os,"edge:");
  this_00 = std::
            __shared_ptr_access<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->_process);
  psVar2 = process_declaration_t::name_abi_cxx11_(this_00);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<(poVar1,":");
  peVar3 = std::
           __shared_ptr_access<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_src);
  psVar2 = location_declaration_t::name_abi_cxx11_(peVar3);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<(poVar1,":");
  peVar3 = std::
           __shared_ptr_access<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_tgt);
  psVar2 = location_declaration_t::name_abi_cxx11_(peVar3);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<(poVar1,":");
  this_01 = std::
            __shared_ptr_access<const_tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->_event);
  psVar2 = event_declaration_t::name_abi_cxx11_(this_01);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = parsing::operator<<(poVar1,&(this->super_inner_declaration_t).super_declaration_t._attr);
  return poVar1;
}

Assistant:

std::ostream & edge_declaration_t::output(std::ostream & os) const
{
  return os << "edge:" << _process->name() << ":" << _src->name() << ":" << _tgt->name() << ":" << _event->name() << _attr;
}